

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ExpressionLhs<bool>::endExpression(ExpressionLhs<bool> *this)

{
  byte bVar1;
  ResultBuilder *this_00;
  undefined8 *in_RDI;
  bool value;
  string *lhs;
  ResultBuilder *this_01;
  bool in_stack_ffffffffffffffdf;
  
  bVar1 = *(byte *)(in_RDI + 1);
  lhs = (string *)*in_RDI;
  this_01 = (ResultBuilder *)&stack0xffffffffffffffd0;
  Catch::toString_abi_cxx11_(in_stack_ffffffffffffffdf);
  this_00 = ResultBuilder::setLhs(this_01,lhs);
  ResultBuilder::setResultType(this_00,(bool)(bVar1 & 1));
  ResultBuilder::endExpression(this_01);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }